

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  undefined8 uVar3;
  TargetType TVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  cmCompiledGeneratorExpression *pcVar8;
  cmGlobalGenerator *pcVar9;
  bool bVar10;
  byte local_41a;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [8];
  string suffix;
  undefined1 local_2b0 [7];
  bool useEPN;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  string local_240;
  undefined1 local_220 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge_1;
  undefined1 local_1e8 [8];
  cmGeneratorExpression ge_1;
  string local_1c0;
  char *local_1a0;
  char *outdir;
  undefined1 local_178 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_140 [8];
  cmGeneratorExpression ge;
  string local_118;
  char *local_f8;
  char *config_outdir;
  string configPropStr;
  char *configProp;
  string configUpper;
  string propertyNameStr;
  char *propertyName;
  string local_70 [8];
  string targetTypeName;
  string conf;
  bool usesDefaultOutputDir;
  string *out_local;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(targetTypeName.field_2._M_local_buf + 8),(string *)config)
  ;
  pcVar6 = GetOutputTargetType(this,artifact);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar6,(allocator *)((long)&propertyName + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&propertyName + 3));
  propertyNameStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),local_70);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(configUpper.field_2._M_local_buf + 8),"_OUTPUT_DIRECTORY");
    propertyNameStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  cmsys::SystemTools::UpperCase((string *)&configProp,(string *)((long)&targetTypeName.field_2 + 8))
  ;
  configPropStr.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&config_outdir,local_70);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&config_outdir,"_OUTPUT_DIRECTORY_");
    std::__cxx11::string::operator+=((string *)&config_outdir,(string *)&configProp);
    configPropStr.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar3 = configPropStr.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,(char *)uVar3,(allocator *)((long)&ge.Backtrace.Cur + 7));
  pcVar6 = GetProperty(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ge.Backtrace.Cur + 7));
  local_f8 = pcVar6;
  if (pcVar6 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c0,(char *)propertyNameStr.field_2._8_8_,
               (allocator *)((long)&ge_1.Backtrace.Cur + 7));
    pcVar6 = GetProperty(this,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ge_1.Backtrace.Cur + 7));
    local_1a0 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      TVar4 = GetType(this);
      if (TVar4 == EXECUTABLE) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_260,"EXECUTABLE_OUTPUT_PATH",&local_261);
        pcVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_260);
        std::__cxx11::string::operator=((string *)out,pcVar6);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
      }
      else {
        TVar4 = GetType(this);
        if (((TVar4 == STATIC_LIBRARY) || (TVar4 = GetType(this), TVar4 == SHARED_LIBRARY)) ||
           (TVar4 = GetType(this), TVar4 == MODULE_LIBRARY)) {
          pcVar2 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_288,"LIBRARY_OUTPUT_PATH",&local_289);
          pcVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_288);
          std::__cxx11::string::operator=((string *)out,pcVar6);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
      }
    }
    else {
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_1e8,(cmListFileBacktrace *)&cge_1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge_1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_220,local_1e8);
      local_220._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_220);
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)(local_220 + 0x10),
                 (auto_ptr_ref<cmCompiledGeneratorExpression>)local_220._8_8_);
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_220);
      pcVar8 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                         ((auto_ptr<cmCompiledGeneratorExpression> *)(local_220 + 0x10));
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_240);
      pcVar6 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar8,pcVar1,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_240
                         );
      std::__cxx11::string::operator=((string *)out,pcVar6);
      std::__cxx11::string::~string((string *)&local_240);
      bVar10 = std::operator!=(out,local_1a0);
      if (bVar10) {
        std::__cxx11::string::operator=((string *)(targetTypeName.field_2._M_local_buf + 8),"");
      }
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)(local_220 + 0x10));
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1e8);
    }
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_140,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_178,local_140);
    local_178._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_178);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_178._8_8_);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_178);
    pcVar8 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10));
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar8,pcVar1,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)out,pcVar6);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::operator=((string *)(targetTypeName.field_2._M_local_buf + 8),"");
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_178 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_140);
  }
  uVar7 = std::__cxx11::string::empty();
  bVar10 = (uVar7 & 1) != 0;
  if (bVar10) {
    std::__cxx11::string::operator=((string *)out,".");
  }
  pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)local_2b0,out,pcVar6);
  std::__cxx11::string::operator=((string *)out,(string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])
                      (this->GlobalGenerator,this->Makefile);
    suffix.field_2._M_local_buf[0xf] = (byte)iVar5 & 1;
    local_41a = 0;
    if (bVar10) {
      local_41a = suffix.field_2._M_local_buf[0xf];
    }
    pcVar6 = "";
    if (local_41a != 0) {
      pcVar6 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,pcVar6,&local_2d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    pcVar9 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"/",&local_301);
    (*pcVar9->_vptr_cmGlobalGenerator[0x12])
              (pcVar9,local_300,(undefined1 *)((long)&targetTypeName.field_2 + 8),local_2d8,out);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    std::__cxx11::string::~string(local_2d8);
  }
  std::__cxx11::string::~string((string *)&config_outdir);
  std::__cxx11::string::~string((string *)&configProp);
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)(targetTypeName.field_2._M_local_buf + 8));
  return bVar10;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = CM_NULLPTR;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = CM_NULLPTR;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf = "";
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}